

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdout_sinks-inl.h
# Opt level: O3

void __thiscall
spdlog::sinks::stderr_sink<spdlog::details::console_nullmutex>::stderr_sink
          (stderr_sink<spdlog::details::console_nullmutex> *this)

{
  FILE *pFVar1;
  formatter *in_RAX;
  
  pFVar1 = _stderr;
  (this->super_stdout_sink_base<spdlog::details::console_nullmutex>).super_sink.level_.
  super___atomic_base<int>._M_i = 0;
  (this->super_stdout_sink_base<spdlog::details::console_nullmutex>).super_sink._vptr_sink =
       (_func_int **)&PTR__stdout_sink_base_0017ee58;
  (this->super_stdout_sink_base<spdlog::details::console_nullmutex>).mutex_ =
       (mutex_t *)&details::console_nullmutex::mutex()::s_mutex;
  (this->super_stdout_sink_base<spdlog::details::console_nullmutex>).file_ = pFVar1;
  details::make_unique<spdlog::pattern_formatter>();
  (this->super_stdout_sink_base<spdlog::details::console_nullmutex>).formatter_._M_t.
  super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
  super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
  super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl = in_RAX;
  (this->super_stdout_sink_base<spdlog::details::console_nullmutex>).super_sink._vptr_sink =
       (_func_int **)&PTR__stdout_sink_base_0017ef58;
  return;
}

Assistant:

SPDLOG_INLINE stderr_sink<ConsoleMutex>::stderr_sink()
    : stdout_sink_base<ConsoleMutex>(stderr) {}